

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

bool __thiscall
crnlib::dxt_hc::update_progress
          (dxt_hc *this,uint phase_index,uint subphase_index,uint subphase_total)

{
  crn_bool cVar1;
  uint local_3c;
  bool status;
  int percentage_complete;
  uint subphase_total_local;
  uint subphase_index_local;
  uint phase_index_local;
  dxt_hc *this_local;
  
  if ((this->m_params).m_pProgress_func == (crn_progress_callback_func)0x0) {
    this_local._7_1_ = true;
  }
  else {
    if (subphase_total < 2) {
      local_3c = 100;
    }
    else {
      local_3c = (subphase_index * 100) / (subphase_total - 1);
    }
    if ((phase_index == this->m_prev_phase_index) && (this->m_prev_percentage_complete == local_3c))
    {
      this_local._7_1_ = (bool)((this->m_canceled ^ 0xffU) & 1);
    }
    else {
      this->m_prev_percentage_complete = local_3c;
      cVar1 = (*(this->m_params).m_pProgress_func)
                        (phase_index,0x19,subphase_index,subphase_total,
                         (this->m_params).m_pProgress_func_data);
      if (cVar1 == 0) {
        this->m_canceled = true;
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool dxt_hc::update_progress(uint phase_index, uint subphase_index, uint subphase_total)
    {
        CRNLIB_ASSERT(crn_get_current_thread_id() == m_main_thread_id);

        if (!m_params.m_pProgress_func)
        {
            return true;
        }

        const int percentage_complete = (subphase_total > 1) ? ((100 * subphase_index) / (subphase_total - 1)) : 100;
        if (((int)phase_index == m_prev_phase_index) && (m_prev_percentage_complete == percentage_complete))
        {
            return !m_canceled;
        }

        m_prev_percentage_complete = percentage_complete;

        bool status = (*m_params.m_pProgress_func)(phase_index, cTotalCompressionPhases, subphase_index, subphase_total, m_params.m_pProgress_func_data) != 0;
        if (!status)
        {
            m_canceled = true;
            return false;
        }

        return true;
    }